

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

enable_if_t<((std::is_integral<unsigned_long>::value)_&&_(std::is_unsigned<unsigned_long>::value)),_unsigned_long>
 math::wide_integer::detail::gcd_unsafe<unsigned_long>(unsigned_long u,unsigned_long v)

{
  enable_if_t<((std::is_integral<unsigned_long>::value)_&&_(std::is_unsigned<unsigned_long>::value)),_unsigned_int>
  eVar1;
  enable_if_t<((std::is_integral<unsigned_long>::value)_&&_(std::is_unsigned<unsigned_long>::value)),_unsigned_int>
  eVar2;
  ulong uVar3;
  ulong v_00;
  ulong uVar4;
  ulong uVar5;
  unsigned_long uVar6;
  
  uVar6 = v;
  if ((u != 0) && (uVar6 = u, v != 0)) {
    eVar1 = ctz_unsafe<unsigned_long>(u);
    eVar2 = ctz_unsafe<unsigned_long>(v);
    if (eVar1 <= eVar2) {
      eVar2 = eVar1;
    }
    v_00 = v >> ((byte)eVar2 & 0x3f);
    uVar5 = u >> ((byte)eVar1 & 0x3f);
    do {
      eVar1 = ctz_unsafe<unsigned_long>(v_00);
      uVar4 = v_00 >> ((byte)eVar1 & 0x3f);
      uVar3 = uVar5 - uVar4;
      v_00 = uVar3;
      if (uVar5 < uVar4 || uVar3 == 0) {
        v_00 = -(uVar5 - uVar4);
      }
      if (uVar5 < uVar4) {
        uVar4 = uVar5;
      }
      uVar5 = uVar4;
    } while (uVar3 != 0);
    uVar6 = uVar4 << ((byte)eVar2 & 0x3f);
  }
  return uVar6;
}

Assistant:

constexpr auto gcd_unsafe(UnsignedIntegralType u, UnsignedIntegralType v) -> std::enable_if_t<(   (std::is_integral<UnsignedIntegralType>::value) // NOLINT(altera-id-dependent-backward-branch)
                                                                                                 && (std::is_unsigned<UnsignedIntegralType>::value)), UnsignedIntegralType>
  {
    using local_unsigned_integral_type = UnsignedIntegralType;

    // Handle cases having (u != 0) and (v != 0).
    if(u == static_cast<local_unsigned_integral_type>(UINT8_C(0))) { return v; }

    if(v == static_cast<local_unsigned_integral_type>(UINT8_C(0))) { return u; }

    // Shift the greatest power of 2 dividing both u and v.
    const unsigned trz { static_cast<unsigned>(ctz_unsafe(u)) };

    const unsigned shift_amount { detail::min_unsafe(trz, ctz_unsafe(v)) };

    v >>= shift_amount;
    u >>= trz;

    do
    {
      // Reduce the GCD.

      v >>= ctz_unsafe(v);

      if(u > v)
      {
        swap_unsafe(u, v);
      }

      v -= u;
    }
    while(v != static_cast<local_unsigned_integral_type>(UINT8_C(0))); // NOLINT(altera-id-dependent-backward-branch)

    return static_cast<local_unsigned_integral_type>(u << shift_amount);
  }